

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.cpp
# Opt level: O0

void __thiscall
QRandomGenerator::SystemGenerator::generate(SystemGenerator *this,quint32 *begin,quint32 *end)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint *__first;
  qsizetype qVar5;
  long in_RDX;
  uint *in_RSI;
  long in_FS_OFFSET;
  qsizetype bytesFilled;
  qsizetype filled;
  qsizetype count;
  quint32 *buffer;
  uint value;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffb0;
  uint *in_stack_ffffffffffffffb8;
  longlong in_stack_ffffffffffffffc0;
  uint *puVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first = (uint *)(in_RDX - (long)in_RSI >> 2);
  uVar3 = anon_struct_1_0_00000001::loadAcquire
                    ((anon_struct_1_0_00000001 *)&qt_randomdevice_control);
  if ((uVar3 & 8) == 0) {
    puVar7 = (uint *)0x0;
    bVar2 = qHasHwrng();
    uVar6 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffac);
    if ((bVar2) &&
       (in_stack_ffffffffffffffa8 =
             anon_struct_1_0_00000001::loadAcquire
                       ((anon_struct_1_0_00000001 *)&qt_randomdevice_control),
       (in_stack_ffffffffffffffa8 & 4) == 0)) {
      qVar5 = qRandomCpu((void *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                         CONCAT44(uVar6,in_stack_ffffffffffffffa8));
      puVar7 = (uint *)(qVar5 + (long)puVar7);
    }
    if ((puVar7 != __first) &&
       (uVar4 = anon_struct_1_0_00000001::loadAcquire
                          ((anon_struct_1_0_00000001 *)&qt_randomdevice_control), (uVar4 & 2) == 0))
    {
      qVar5 = fillBuffer((void *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                         CONCAT44(uVar6,in_stack_ffffffffffffffa8));
      puVar7 = (uint *)(qVar5 / 4 + (long)puVar7);
    }
    if (puVar7 != (uint *)0x0) {
      fallback_update_seed(*in_RSI);
    }
    if (puVar7 != __first) {
      fallback_fill();
    }
  }
  else {
    anon_struct_1_0_00000001::loadAcquire((anon_struct_1_0_00000001 *)&qt_randomdevice_control);
    std::fill_n<unsigned_int*,long_long,unsigned_int>
              (__first,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QRandomGenerator::SystemGenerator::generate(quint32 *begin, quint32 *end)
    noexcept(FillBufferNoexcept)
{
    quint32 *buffer = begin;
    qsizetype count = end - begin;

    if (Q_UNLIKELY(uint(qt_randomdevice_control.loadAcquire()) & SetRandomData)) {
        uint value = uint(qt_randomdevice_control.loadAcquire()) & RandomDataMask;
        std::fill_n(buffer, count, value);
        return;
    }

    qsizetype filled = 0;
    if (qHasHwrng() && (uint(qt_randomdevice_control.loadAcquire()) & SkipHWRNG) == 0)
        filled += qRandomCpu(buffer, count);

    if (filled != count && (uint(qt_randomdevice_control.loadAcquire()) & SkipSystemRNG) == 0) {
        qsizetype bytesFilled =
                fillBuffer(buffer + filled, (count - filled) * qsizetype(sizeof(*buffer)));
        filled += bytesFilled / qsizetype(sizeof(*buffer));
    }
    if (filled)
        fallback_update_seed(*buffer);

    if (Q_UNLIKELY(filled != count)) {
        // failed to fill the entire buffer, try the faillback mechanism
        fallback_fill(buffer + filled, count - filled);
    }
}